

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templates.h
# Opt level: O1

double compute_area<2ul,std::tuple<Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>>
                 (tuple<Point<double>,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>
                  *tuple)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = (tuple->
          super__Tuple_impl<0UL,_Point<double>,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>
          ).super__Head_base<0UL,_Point<double>,_false>._M_head_impl.x;
  dVar2 = (tuple->
          super__Tuple_impl<0UL,_Point<double>,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>
          ).super__Tuple_impl<1UL,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>.
          super__Tuple_impl<2UL,_Point<double>,_Point<double>,_Point<double>_>.
          super__Head_base<2UL,_Point<double>,_false>._M_head_impl.x;
  dVar3 = (tuple->
          super__Tuple_impl<0UL,_Point<double>,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>
          ).super__Tuple_impl<1UL,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>.
          super__Tuple_impl<2UL,_Point<double>,_Point<double>,_Point<double>_>.
          super__Head_base<2UL,_Point<double>,_false>._M_head_impl.y;
  dVar4 = (tuple->
          super__Tuple_impl<0UL,_Point<double>,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>
          ).super__Head_base<0UL,_Point<double>,_false>._M_head_impl.y;
  dVar5 = (tuple->
          super__Tuple_impl<0UL,_Point<double>,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>
          ).super__Tuple_impl<1UL,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>.
          super__Head_base<1UL,_Point<double>,_false>._M_head_impl.x;
  dVar6 = (tuple->
          super__Tuple_impl<0UL,_Point<double>,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>
          ).super__Tuple_impl<1UL,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>.
          super__Head_base<1UL,_Point<double>,_false>._M_head_impl.y;
  dVar7 = compute_area<3ul,std::tuple<Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>>
                    (tuple);
  return dVar7 + ABS((dVar6 - dVar4) * (dVar2 - dVar1) - (dVar5 - dVar1) * (dVar3 - dVar4)) * 0.5;
}

Assistant:

double compute_area(const T& tuple) {
    if constexpr (Id >= std::tuple_size_v<T>){
        return 0;
    }else{
        const auto dx1 = std::get<Id - 0>(tuple).x - std::get<0>(tuple).x;
        const auto dy1 = std::get<Id - 0>(tuple).y - std::get<0>(tuple).y;
        const auto dx2 = std::get<Id - 1>(tuple).x - std::get<0>(tuple).x;
        const auto dy2 = std::get<Id - 1>(tuple).y - std::get<0>(tuple).y;
        const double local_area = std::abs(dx1 * dy2 - dy1 * dx2) * 0.5;
        return local_area + compute_area<Id + 1>(tuple);
    }
}